

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManGlitching(Gli_Man_t *p)

{
  uint *puVar1;
  int Phase;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  uint uVar7;
  
  p->vAffected->nSize = 0;
  for (iVar6 = 0; iVar6 < p->vCisChanged->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p->vCisChanged,iVar6);
    Vec_IntPush(p->vAffected,iVar2);
  }
  do {
    p_00 = p->vAffected;
    if (p_00->nSize < 1) {
      return;
    }
    p->vFrontier->nSize = 0;
    for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar6);
      if (p->pObjData == (int *)0x0) {
        p_00 = p->vAffected;
        break;
      }
      puVar1 = (uint *)(p->pObjData + iVar2);
      uVar7 = 0;
      while( true ) {
        if (*puVar1 >> 7 <= uVar7) break;
        lVar4 = (long)(int)puVar1[(ulong)((*puVar1 >> 4 & 7) + uVar7) + 7];
        uVar3 = puVar1[lVar4];
        if ((char)((uVar3 & 8) >> 3) == '\0' && (uVar3 & 0x71) != 0x11) {
          puVar1[lVar4] = uVar3 | 8;
          Vec_IntPush(p->vFrontier,puVar1[lVar4 + 1]);
        }
        uVar7 = uVar7 + 1;
      }
      p_00 = p->vAffected;
    }
    p_00->nSize = 0;
    for (iVar6 = 0; iVar6 < p->vFrontier->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(p->vFrontier,iVar6);
      puVar1 = (uint *)(p->pObjData + iVar2);
      if (p->pObjData == (int *)0x0) break;
      uVar7 = *puVar1;
      *puVar1 = uVar7 & 0xfffffff7;
      uVar3 = 0;
      for (uVar5 = 0; (uVar7 >> 4 & 7) != uVar5; uVar5 = uVar5 + 1) {
        uVar3 = uVar3 | (puVar1[-(long)(int)puVar1[uVar5 + 7]] >> 2 & 1) << ((byte)uVar5 & 0x1f);
      }
      if (((puVar1[(long)((int)uVar3 >> 5) + 2] >> ((byte)uVar3 & 0x1f) ^ uVar7 >> 2) & 1) != 0) {
        *puVar1 = uVar7 & 0xfffffff7 ^ 4;
        puVar1[6] = puVar1[6] + 1;
        Vec_IntPush(p->vAffected,puVar1[1]);
      }
    }
  } while( true );
}

Assistant:

void Gli_ManGlitching( Gli_Man_t * p )
{
    Gli_Obj_t * pThis, * pFanout;//, * pOther = Gli_ManObj(p, 41);
    int i, k, Handle;
//    Gli_ManForEachObj( p, pThis, i )
//        assert( pThis->fMark == 0 );
    // start the array of affected nodes
    Vec_IntClear( p->vAffected );
    Vec_IntForEachEntry( p->vCisChanged, Handle, i )
        Vec_IntPush( p->vAffected, Handle );
    // iteration propagation
    while ( Vec_IntSize(p->vAffected) > 0 )
    {
        // compute the frontier
        Vec_IntClear( p->vFrontier );
        Gli_ManForEachEntry( p->vAffected, p, pThis, i )
        {
            Gli_ObjForEachFanout( pThis, pFanout, k )
            {
                if ( Gli_ObjIsCo(pFanout) )
                    continue;
                if ( pFanout->fMark )
                    continue;
                pFanout->fMark = 1;
                Vec_IntPush( p->vFrontier, pFanout->Handle );
            }
        }
        // compute the next set of affected nodes
        Vec_IntClear( p->vAffected );
        Gli_ManForEachEntry( p->vFrontier, p, pThis, i )
        {
            pThis->fMark = 0;
            if ( ((int)pThis->fPhase2) == Gli_NodeComputeValue2(pThis) )
                continue;
            pThis->fPhase2 ^= 1;
            pThis->nGlitches++;
            Vec_IntPush( p->vAffected, pThis->Handle );
        }
    }
}